

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall cmTarget::AppendBuildInterfaceIncludes(cmTarget *this)

{
  cmMakefile *this_00;
  bool bVar1;
  string *psVar2;
  allocator<char> local_99;
  string dirs;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (((INTERFACE_LIBRARY < this->TargetTypeValue) ||
      ((0x8eU >> (this->TargetTypeValue & 0x1f) & 1) == 0)) &&
     (bVar1 = IsExecutableWithExports(this), !bVar1)) {
    return;
  }
  if (this->BuildInterfaceIncludesAppended == false) {
    this->BuildInterfaceIncludesAppended = true;
    this_00 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&dirs,"CMAKE_INCLUDE_CURRENT_DIR_IN_INTERFACE",(allocator<char> *)&local_78
              );
    bVar1 = cmMakefile::IsOn(this_00,&dirs);
    std::__cxx11::string::~string((string *)&dirs);
    if (bVar1) {
      psVar2 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this->Makefile);
      std::__cxx11::string::string((string *)&dirs,(string *)psVar2);
      if (dirs._M_string_length != 0) {
        std::__cxx11::string::push_back((char)&dirs);
      }
      cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this->Makefile);
      std::__cxx11::string::append((string *)&dirs);
      if (dirs._M_string_length != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,"INTERFACE_INCLUDE_DIRECTORIES",&local_99);
        std::operator+(&local_58,"$<BUILD_INTERFACE:",&dirs);
        std::operator+(&local_38,&local_58,">");
        AppendProperty(this,&local_78,local_38._M_dataplus._M_p,false);
        std::__cxx11::string::~string((string *)&local_38);
        std::__cxx11::string::~string((string *)&local_58);
        std::__cxx11::string::~string((string *)&local_78);
      }
      std::__cxx11::string::~string((string *)&dirs);
    }
  }
  return;
}

Assistant:

void cmTarget::AppendBuildInterfaceIncludes()
{
  if (this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::STATIC_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      !this->IsExecutableWithExports()) {
    return;
  }
  if (this->BuildInterfaceIncludesAppended) {
    return;
  }
  this->BuildInterfaceIncludesAppended = true;

  if (this->Makefile->IsOn("CMAKE_INCLUDE_CURRENT_DIR_IN_INTERFACE")) {
    std::string dirs = this->Makefile->GetCurrentBinaryDirectory();
    if (!dirs.empty()) {
      dirs += ';';
    }
    dirs += this->Makefile->GetCurrentSourceDirectory();
    if (!dirs.empty()) {
      this->AppendProperty("INTERFACE_INCLUDE_DIRECTORIES",
                           ("$<BUILD_INTERFACE:" + dirs + ">").c_str());
    }
  }
}